

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-definition.c
# Opt level: O2

coda_product_definition *
coda_product_type_get_latest_product_definition(coda_product_type *product_type)

{
  coda_product_definition **ppcVar1;
  ulong uVar2;
  coda_product_definition *pcVar3;
  int iVar4;
  ulong uVar5;
  
  if ((long)product_type->num_product_definitions == 0) {
    pcVar3 = (coda_product_definition *)0x0;
    coda_set_error(-400,"product type %s does not contain any definitions",product_type->name);
  }
  else {
    ppcVar1 = product_type->product_definition;
    iVar4 = (*ppcVar1)->version;
    uVar2 = 0;
    for (uVar5 = 1; (long)uVar5 < (long)product_type->num_product_definitions; uVar5 = uVar5 + 1) {
      if (iVar4 < ppcVar1[uVar5]->version) {
        uVar2 = uVar5 & 0xffffffff;
        iVar4 = ppcVar1[uVar5]->version;
      }
    }
    pcVar3 = ppcVar1[(int)uVar2];
  }
  return pcVar3;
}

Assistant:

coda_product_definition *coda_product_type_get_latest_product_definition(const coda_product_type *product_type)
{
    int max_version;
    int max_i;
    int i;

    if (product_type->num_product_definitions == 0)
    {
        coda_set_error(CODA_ERROR_DATA_DEFINITION, "product type %s does not contain any definitions",
                       product_type->name);
        return NULL;
    }
    max_version = product_type->product_definition[0]->version;
    max_i = 0;
    for (i = 1; i < product_type->num_product_definitions; i++)
    {
        if (product_type->product_definition[i]->version > max_version)
        {
            max_version = product_type->product_definition[i]->version;
            max_i = i;
        }
    }

    return product_type->product_definition[max_i];
}